

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantPool.cc
# Opt level: O3

size_t __thiscall flow::ConstantPool::makeNativeHandler(ConstantPool *this,string *sig)

{
  pointer pbVar1;
  pointer __s2;
  size_t __n;
  int iVar2;
  size_type *psVar3;
  long lVar4;
  size_t sVar5;
  
  pbVar1 = (this->nativeHandlerSignatures_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->nativeHandlerSignatures_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar4 != 0) {
    __s2 = (sig->_M_dataplus)._M_p;
    __n = sig->_M_string_length;
    psVar3 = &pbVar1->_M_string_length;
    sVar5 = 0;
    do {
      if (*psVar3 == __n) {
        if (__n == 0) {
          return sVar5;
        }
        iVar2 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (psVar3 + -1))->_M_dataplus)._M_p,__s2,__n);
        if (iVar2 == 0) {
          return sVar5;
        }
      }
      sVar5 = sVar5 + 1;
      psVar3 = psVar3 + 4;
    } while (lVar4 >> 5 != sVar5);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->nativeHandlerSignatures_,sig);
  return ((long)(this->nativeHandlerSignatures_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->nativeHandlerSignatures_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
}

Assistant:

size_t ConstantPool::makeNativeHandler(const std::string& sig) {
  return ensureValue(nativeHandlerSignatures_, sig);
}